

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_SetOutputFilterParameters
                   (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
                   FAudioFilterParameters *pParameters,uint32_t OperationSet)

{
  uint32_t in_ECX;
  FAudioFilterParameters *in_RDX;
  FAudioVoice *in_RSI;
  FAudioVoice *in_RDI;
  uint32_t i;
  uint local_28;
  uint32_t local_4;
  
  if ((in_ECX == 0) || (in_RDI->audio->active == '\0')) {
    if (in_RDI->type == FAUDIO_VOICE_MASTER) {
      local_4 = 0;
    }
    else {
      FAudio_PlatformLockMutex((FAudioMutex)0x127edd);
      if ((in_RSI == (FAudioVoice *)0x0) && ((in_RDI->sends).SendCount == 1)) {
        in_RSI = ((in_RDI->sends).pSends)->pOutputVoice;
      }
      local_28 = 0;
      while ((local_28 < (in_RDI->sends).SendCount &&
             (in_RSI != (in_RDI->sends).pSends[local_28].pOutputVoice))) {
        local_28 = local_28 + 1;
      }
      if (local_28 < (in_RDI->sends).SendCount) {
        if (((in_RDI->sends).pSends[local_28].Flags & 0x80) == 0) {
          FAudio_PlatformUnlockMutex((FAudioMutex)0x127f9b);
          local_4 = 0;
        }
        else {
          SDL_memcpy(in_RDI->sendFilter + local_28,in_RDX,0xc);
          FAudio_PlatformUnlockMutex((FAudioMutex)0x127fd8);
          local_4 = 0;
        }
      }
      else {
        FAudio_PlatformUnlockMutex((FAudioMutex)0x127f61);
        local_4 = 0x88960001;
      }
    }
  }
  else {
    FAudio_OPERATIONSET_QueueSetOutputFilterParameters(in_RDI,in_RSI,in_RDX,in_ECX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FAudioVoice_SetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	const FAudioFilterParameters *pParameters,
	uint32_t OperationSet
) {
	uint32_t i;
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetOutputFilterParameters(
			voice,
			pDestinationVoice,
			pParameters,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		&voice->sendFilter[i],
		pParameters,
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}